

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DNSResolver.cpp
# Opt level: O0

void __thiscall DNSResolver::reciveAndParse(DNSResolver *this)

{
  uint16_t uVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t sVar4;
  uchar *puVar5;
  R_DATA *pRVar6;
  int local_210;
  int local_20c;
  int i_1;
  int j;
  int i;
  int stop;
  uchar *reader;
  RES_RECORD answers [20];
  DNSResolver *this_local;
  
  sVar2 = recv(this->sockfd,this,0x10000,0);
  if (sVar2 < 1) {
    piVar3 = __errno_location();
    if (*piVar3 != 0xb) {
      this->drop = true;
    }
  }
  else {
    this->responseRecived = true;
    sVar4 = strlen((char *)this->qname);
    _i = this->buf + sVar4 + 0x11;
    j = 0;
    for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
      puVar5 = ReadName(this,_i,this->buf,&j);
      answers[(long)i_1 + -1].rdata = puVar5;
      answers[i_1].name = _i + j;
      _i = _i + j + 10;
      uVar1 = ntohs(*(uint16_t *)answers[i_1].name);
      if (uVar1 == 1) {
        uVar1 = ntohs(*(uint16_t *)(answers[i_1].name + 8));
        pRVar6 = (R_DATA *)malloc((long)(int)(uVar1 + 1));
        answers[i_1].resource = pRVar6;
        for (local_20c = 0; uVar1 = ntohs(*(uint16_t *)(answers[i_1].name + 8)),
            local_20c < (int)(uint)uVar1; local_20c = local_20c + 1) {
          *(uchar *)((long)&(answers[i_1].resource)->type + (long)local_20c) = _i[local_20c];
        }
        pRVar6 = answers[i_1].resource;
        uVar1 = ntohs(*(uint16_t *)(answers[i_1].name + 8));
        puVar5 = _i;
        *(undefined1 *)((long)&pRVar6->type + (ulong)uVar1) = 0;
        uVar1 = ntohs(*(uint16_t *)(answers[i_1].name + 8));
        _i = puVar5 + (int)(uint)uVar1;
      }
      else {
        pRVar6 = (R_DATA *)ReadName(this,_i,this->buf,&j);
        answers[i_1].resource = pRVar6;
        _i = _i + j;
      }
    }
    uVar1 = ntohs(this->dns->ans_count);
    if (uVar1 < 2) {
      uVar1 = ntohs(this->dns->ans_count);
      if (uVar1 != 0) {
        this->s_addr = *(long *)answers[0].resource;
      }
    }
    else {
      this->s_addr = *(long *)answers[1].resource;
    }
    for (local_210 = 0; local_210 < 2; local_210 = local_210 + 1) {
      free(answers[local_210].resource);
      free(answers[(long)local_210 + -1].rdata);
    }
  }
  return;
}

Assistant:

void DNSResolver::reciveAndParse() {
    if (::recv(sockfd, (char *) buf, 65536, 0) <= 0) {
        if (errno != EWOULDBLOCK) {
            drop = true;
        }
        return;
    }
    responseRecived = true;

    struct RES_RECORD answers[20];
    unsigned char *reader = &buf[sizeof(struct DNS_HEADER) + (strlen((const char *) qname) + 1) +
                                 sizeof(struct QUESTION)];

    //Start reading answers
    int stop = 0;
    for (int i = 0; i < 2; i++) {
        answers[i].name = ReadName(reader, buf, &stop);
        reader = reader + stop;

        answers[i].resource = (struct R_DATA *) (reader);
        reader = reader + sizeof(struct R_DATA);

        if (ntohs(answers[i].resource->type) == 1) //if its an ipv4 address
        {
            answers[i].rdata = (unsigned char *) malloc(ntohs(answers[i].resource->data_len) + 1);

            for (int j = 0; j < ntohs(answers[i].resource->data_len); j++) {
                answers[i].rdata[j] = reader[j];
            }

            answers[i].rdata[ntohs(answers[i].resource->data_len)] = '\0';

            reader = reader + ntohs(answers[i].resource->data_len);
        } else {
            answers[i].rdata = ReadName(reader, buf, &stop);
            reader = reader + stop;
        }
    }
    if (ntohs(dns->ans_count) > 1)
        s_addr = *((long *) answers[1].rdata);
    else if (ntohs(dns->ans_count) > 0)
        s_addr = *((long *) answers[0].rdata);
    for (int i = 0; i < 2; i++) {
               free(answers[i].rdata);
               free(answers[i].name);
    }
}